

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_close.c
# Opt level: O3

int write_data_descriptor(zip_t *za,zip_dirent_t *de,int is_zip64)

{
  _Bool _Var1;
  int iVar2;
  zip_buffer_t *buffer;
  zip_uint8_t *data;
  zip_uint64_t length;
  
  buffer = _zip_buffer_new((zip_uint8_t *)0x0,0x18);
  if (buffer == (zip_buffer_t *)0x0) {
    zip_error_set(&za->error,0xe,0);
    iVar2 = -1;
  }
  else {
    _zip_buffer_put(buffer,"PK\a\b",4);
    _zip_buffer_put_32(buffer,de->crc);
    if (is_zip64 == 0) {
      _zip_buffer_put_32(buffer,(zip_uint32_t)de->comp_size);
      _zip_buffer_put_32(buffer,(zip_uint32_t)de->uncomp_size);
    }
    else {
      _zip_buffer_put_64(buffer,de->comp_size);
      _zip_buffer_put_64(buffer,de->uncomp_size);
    }
    _Var1 = _zip_buffer_ok(buffer);
    if (_Var1) {
      data = _zip_buffer_data(buffer);
      length = _zip_buffer_offset(buffer);
      iVar2 = _zip_write(za,data,length);
    }
    else {
      zip_error_set(&za->error,0x14,0);
      iVar2 = -1;
    }
    _zip_buffer_free(buffer);
  }
  return iVar2;
}

Assistant:

static int
write_data_descriptor(zip_t *za, const zip_dirent_t *de, int is_zip64) {
    zip_buffer_t *buffer = _zip_buffer_new(NULL, MAX_DATA_DESCRIPTOR_LENGTH);
    int ret = 0;

    if (buffer == NULL) {
        zip_error_set(&za->error, ZIP_ER_MEMORY, 0);
        return -1;
    }

    _zip_buffer_put(buffer, DATADES_MAGIC, 4);
    _zip_buffer_put_32(buffer, de->crc);
    if (is_zip64) {
        _zip_buffer_put_64(buffer, de->comp_size);
        _zip_buffer_put_64(buffer, de->uncomp_size);
    }
    else {
        _zip_buffer_put_32(buffer, (zip_uint32_t)de->comp_size);
        _zip_buffer_put_32(buffer, (zip_uint32_t)de->uncomp_size);
    }

    if (!_zip_buffer_ok(buffer)) {
        zip_error_set(&za->error, ZIP_ER_INTERNAL, 0);
        ret = -1;
    }
    else {
        ret = _zip_write(za, _zip_buffer_data(buffer), _zip_buffer_offset(buffer));
    }

    _zip_buffer_free(buffer);

    return ret;
}